

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_generator.cc
# Opt level: O3

bool __thiscall
google::protobuf::compiler::cpp::CppGenerator::Generate
          (CppGenerator *this,FileDescriptor *file,string *parameter,
          GeneratorContext *generator_context,string *error)

{
  long lVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  FileDescriptor *file_00;
  bool bVar3;
  int iVar4;
  int iVar5;
  string *psVar6;
  ulong uVar7;
  ZeroCopyOutputStream *pZVar8;
  ZeroCopyOutputStream *pZVar9;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  LogMessage *pLVar10;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  long *plVar11;
  int32 iVar12;
  AnnotationCollector *pAVar13;
  ulong uVar14;
  int number;
  ulong uVar15;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  options;
  string basename;
  string info_path;
  AnnotationProtoCollector<google::protobuf::GeneratedCodeInfo> annotation_collector;
  Printer printer;
  Options file_options;
  GeneratedCodeInfo annotations;
  FileGenerator file_generator;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_5d8;
  undefined1 local_5b8 [32];
  undefined1 *local_598;
  long local_590;
  undefined1 local_588 [16];
  string *local_578;
  FileDescriptor *local_570;
  string local_568;
  AnnotationCollector local_548;
  GeneratedCodeInfo *local_540;
  Printer local_538;
  GeneratorContext *local_498;
  undefined1 local_490 [56];
  _Alloc_hider local_458;
  size_type local_450;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_448;
  int32 local_438;
  _Alloc_hider local_430;
  size_type local_428;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_420;
  _Alloc_hider local_410;
  size_type local_408;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_400;
  AccessInfoMap *local_3f0;
  anon_enum_32 local_3e8;
  bool local_3e0;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_3d8;
  undefined2 local_3a8;
  GeneratedCodeInfo local_3a0;
  FileGenerator local_370;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_07;
  
  local_5d8.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_5d8.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_5d8.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ParseGeneratorParameter(parameter,&local_5d8);
  local_490._0_8_ = local_490 + 0x10;
  local_490._8_8_ = 0;
  local_490[0x10] = '\0';
  local_490[0x20] = false;
  local_490[0x21] = false;
  local_490[0x22] = true;
  local_490[0x23] = false;
  local_490._36_4_ = kNoEnforcement;
  local_490[0x28] = false;
  local_490[0x29] = false;
  local_490[0x2a] = false;
  local_490[0x2f] = true;
  local_490[0x30] = false;
  local_458._M_p = (pointer)&local_448;
  local_450 = 0;
  local_448._M_local_buf[0] = '\0';
  local_438 = 0;
  local_430._M_p = (pointer)&local_420;
  local_428 = 0;
  local_420._M_local_buf[0] = '\0';
  local_410._M_p = (pointer)&local_400;
  local_408 = 0;
  local_400._M_local_buf[0] = '\0';
  local_3f0 = (AccessInfoMap *)0x0;
  local_3e8 = kTCTableNever;
  local_3e0 = false;
  local_3d8._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_3d8._M_impl.super__Rb_tree_header._M_header;
  local_3d8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_3d8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_3d8._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_3a8._0_1_ = false;
  local_3a8._1_1_ = false;
  local_490._43_4_ = (uint)this->opensource_runtime_ << 8;
  local_578 = error;
  local_570 = file;
  local_3d8._M_impl.super__Rb_tree_header._M_header._M_right =
       local_3d8._M_impl.super__Rb_tree_header._M_header._M_left;
  std::__cxx11::string::_M_assign((string *)&local_458);
  if (local_5d8.
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish ==
      local_5d8.
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
LAB_002384fa:
    file_00 = local_570;
    if (((bool)local_490[0x20] == true) && (local_490[0x2c] == true)) {
      bVar3 = false;
      std::__cxx11::string::_M_replace
                ((ulong)local_578,0,(char *)local_578->_M_string_length,0x3d9fbf);
    }
    else {
      StripProto((string *)local_5b8,*(string **)local_570);
      bVar3 = MaybeBootstrap((Options *)local_490,generator_context,local_490[0x2b],
                             (string *)local_5b8);
      if (!bVar3) {
        FileGenerator::FileGenerator(&local_370,file_00,(Options *)local_490);
        lVar1 = (long)&local_538 + 0x10;
        if ((bool)local_490[0x21] == true) {
          local_538._0_8_ = lVar1;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_538,local_5b8._0_8_,
                     (anon_unknown_8 *)
                     ((long)&((_Alloc_hider *)local_5b8._8_8_)->_M_p + local_5b8._0_8_));
          std::__cxx11::string::append(&local_538.variable_delimiter_);
          iVar4 = (*generator_context->_vptr_GeneratorContext[2])(generator_context);
          pZVar8 = (ZeroCopyOutputStream *)CONCAT44(extraout_var,iVar4);
          if (local_538._0_8_ != lVar1) {
            operator_delete((void *)local_538._0_8_);
          }
          GeneratedCodeInfo::GeneratedCodeInfo(&local_3a0,(Arena *)0x0,false);
          local_548._vptr_AnnotationCollector = (_func_int **)&PTR_AddAnnotation_004cf430;
          local_598 = local_588;
          local_540 = &local_3a0;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_598,local_5b8._0_8_,
                     (anon_unknown_8 *)
                     ((long)&((_Alloc_hider *)local_5b8._8_8_)->_M_p + local_5b8._0_8_));
          std::__cxx11::string::append((char *)&local_598);
          pAVar13 = &local_548;
          if ((bool)local_490[0x23] == false) {
            pAVar13 = (AnnotationCollector *)0x0;
          }
          io::Printer::Printer(&local_538,pZVar8,'$',pAVar13);
          paVar2 = &local_568.field_2;
          local_568._M_dataplus._M_p = (pointer)paVar2;
          if ((bool)local_490[0x23] == true) {
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_568,local_598,local_598 + local_590);
          }
          else {
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_568,"");
          }
          FileGenerator::GenerateProtoHeader(&local_370,&local_538,&local_568);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_568._M_dataplus._M_p != paVar2) {
            operator_delete(local_568._M_dataplus._M_p);
          }
          if ((bool)local_490[0x23] == true) {
            iVar4 = (*generator_context->_vptr_GeneratorContext[2])(generator_context,&local_598);
            pZVar9 = (ZeroCopyOutputStream *)CONCAT44(extraout_var_00,iVar4);
            MessageLite::SerializeToZeroCopyStream((MessageLite *)&local_3a0,pZVar9);
            if (pZVar9 != (ZeroCopyOutputStream *)0x0) {
              (*pZVar9->_vptr_ZeroCopyOutputStream[1])(pZVar9);
            }
          }
          io::Printer::~Printer(&local_538);
          if (local_598 != local_588) {
            operator_delete(local_598);
          }
          GeneratedCodeInfo::~GeneratedCodeInfo(&local_3a0);
          if (pZVar8 != (ZeroCopyOutputStream *)0x0) {
            (*pZVar8->_vptr_ZeroCopyOutputStream[1])(pZVar8);
          }
        }
        local_538._0_8_ = lVar1;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_538,local_5b8._0_8_,
                   (anon_unknown_8 *)
                   ((long)&((_Alloc_hider *)local_5b8._8_8_)->_M_p + local_5b8._0_8_));
        std::__cxx11::string::append(&local_538.variable_delimiter_);
        iVar4 = (*generator_context->_vptr_GeneratorContext[2])(generator_context);
        pZVar8 = (ZeroCopyOutputStream *)CONCAT44(extraout_var_01,iVar4);
        if (local_538._0_8_ != lVar1) {
          operator_delete((void *)local_538._0_8_);
        }
        GeneratedCodeInfo::GeneratedCodeInfo(&local_3a0,(Arena *)0x0,false);
        local_548._vptr_AnnotationCollector = (_func_int **)&PTR_AddAnnotation_004cf430;
        local_598 = local_588;
        local_540 = &local_3a0;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_598,local_5b8._0_8_,
                   (anon_unknown_8 *)
                   ((long)&((_Alloc_hider *)local_5b8._8_8_)->_M_p + local_5b8._0_8_));
        std::__cxx11::string::append((char *)&local_598);
        pAVar13 = &local_548;
        if ((bool)local_490[0x23] == false) {
          pAVar13 = (AnnotationCollector *)0x0;
        }
        io::Printer::Printer(&local_538,pZVar8,'$',pAVar13);
        paVar2 = &local_568.field_2;
        local_568._M_dataplus._M_p = (pointer)paVar2;
        if ((bool)local_490[0x23] == true) {
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_568,local_598,local_598 + local_590);
        }
        else {
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_568,"");
        }
        FileGenerator::GeneratePBHeader(&local_370,&local_538,&local_568);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_568._M_dataplus._M_p != paVar2) {
          operator_delete(local_568._M_dataplus._M_p);
        }
        if ((bool)local_490[0x23] == true) {
          iVar4 = (*generator_context->_vptr_GeneratorContext[2])(generator_context,&local_598);
          pZVar9 = (ZeroCopyOutputStream *)CONCAT44(extraout_var_02,iVar4);
          MessageLite::SerializeToZeroCopyStream((MessageLite *)&local_3a0,pZVar9);
          if (pZVar9 != (ZeroCopyOutputStream *)0x0) {
            (*pZVar9->_vptr_ZeroCopyOutputStream[1])(pZVar9);
          }
        }
        io::Printer::~Printer(&local_538);
        if (local_598 != local_588) {
          operator_delete(local_598);
        }
        GeneratedCodeInfo::~GeneratedCodeInfo(&local_3a0);
        if (pZVar8 != (ZeroCopyOutputStream *)0x0) {
          (*pZVar8->_vptr_ZeroCopyOutputStream[1])(pZVar8);
        }
        bVar3 = UsingImplicitWeakFields(file_00,(Options *)local_490);
        if (bVar3) {
          local_538._0_8_ = lVar1;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_538,local_5b8._0_8_,
                     (anon_unknown_8 *)
                     ((long)&((_Alloc_hider *)local_5b8._8_8_)->_M_p + local_5b8._0_8_));
          std::__cxx11::string::append(&local_538.variable_delimiter_);
          iVar4 = (*generator_context->_vptr_GeneratorContext[2])(generator_context,&local_538);
          pZVar8 = (ZeroCopyOutputStream *)CONCAT44(extraout_var_03,iVar4);
          if (local_538._0_8_ != lVar1) {
            operator_delete((void *)local_538._0_8_);
          }
          io::Printer::Printer(&local_538,pZVar8,'$');
          FileGenerator::GenerateGlobalSource(&local_370,&local_538);
          io::Printer::~Printer(&local_538);
          if (pZVar8 != (ZeroCopyOutputStream *)0x0) {
            (*pZVar8->_vptr_ZeroCopyOutputStream[1])(pZVar8);
          }
          iVar4 = (int)((ulong)((long)local_370.message_generators_.
                                      super__Vector_base<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                               (long)local_370.message_generators_.
                                     super__Vector_base<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start) >> 3);
          iVar12 = (int)((ulong)((long)local_370.extension_generators_.
                                       super__Vector_base<std::unique_ptr<google::protobuf::compiler::cpp::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::cpp::ExtensionGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::cpp::ExtensionGenerator>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                (long)local_370.extension_generators_.
                                      super__Vector_base<std::unique_ptr<google::protobuf::compiler::cpp::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::cpp::ExtensionGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::cpp::ExtensionGenerator>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start) >> 3) + iVar4;
          if ((0 < local_438) && (bVar3 = local_438 < iVar12, iVar12 = local_438, bVar3)) {
            internal::LogMessage::LogMessage
                      ((LogMessage *)&local_538,LOGLEVEL_DFATAL,
                       "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/compiler/cpp/cpp_generator.cc"
                       ,0xea);
            pLVar10 = internal::LogMessage::operator<<
                                ((LogMessage *)&local_538,
                                 "CHECK failed: (num_cc_files) <= (file_options.num_cc_files): ");
            pLVar10 = internal::LogMessage::operator<<
                                (pLVar10,
                                 "There must be at least as many numbered .cc files as messages and extensions."
                                );
            internal::LogFinisher::operator=((LogFinisher *)&local_3a0,pLVar10);
            internal::LogMessage::~LogMessage((LogMessage *)&local_538);
            iVar4 = (int)((ulong)((long)local_370.message_generators_.
                                        super__Vector_base<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)local_370.message_generators_.
                                       super__Vector_base<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start) >> 3);
            iVar12 = local_438;
          }
          local_570 = (FileDescriptor *)CONCAT44(local_570._4_4_,iVar12);
          number = 0;
          if (0 < iVar4) {
            do {
              anon_unknown_8::NumberedCcFileName
                        ((string *)&local_538,(anon_unknown_8 *)local_5b8._0_8_,
                         (string *)local_5b8._8_8_,number);
              iVar4 = (*generator_context->_vptr_GeneratorContext[2])(generator_context,&local_538);
              pZVar8 = (ZeroCopyOutputStream *)CONCAT44(extraout_var_05,iVar4);
              if (local_538._0_8_ != lVar1) {
                operator_delete((void *)local_538._0_8_);
              }
              io::Printer::Printer(&local_538,pZVar8,'$');
              FileGenerator::GenerateSourceForMessage(&local_370,number,&local_538);
              io::Printer::~Printer(&local_538);
              if (pZVar8 != (ZeroCopyOutputStream *)0x0) {
                (*pZVar8->_vptr_ZeroCopyOutputStream[1])(pZVar8);
              }
              number = number + 1;
            } while (number < (int)((ulong)((long)local_370.message_generators_.
                                                  super__Vector_base<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                           (long)local_370.message_generators_.
                                                 super__Vector_base<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>_>_>
                                                 ._M_impl.super__Vector_impl_data._M_start) >> 3));
          }
          if (0 < (int)((ulong)((long)local_370.extension_generators_.
                                      super__Vector_base<std::unique_ptr<google::protobuf::compiler::cpp::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::cpp::ExtensionGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::cpp::ExtensionGenerator>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                               (long)local_370.extension_generators_.
                                     super__Vector_base<std::unique_ptr<google::protobuf::compiler::cpp::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::cpp::ExtensionGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::cpp::ExtensionGenerator>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start) >> 3)) {
            iVar4 = 0;
            do {
              anon_unknown_8::NumberedCcFileName
                        ((string *)&local_538,(anon_unknown_8 *)local_5b8._0_8_,
                         (string *)local_5b8._8_8_,number + iVar4);
              iVar5 = (*generator_context->_vptr_GeneratorContext[2])(generator_context,&local_538);
              pZVar8 = (ZeroCopyOutputStream *)CONCAT44(extraout_var_06,iVar5);
              if (local_538._0_8_ != (long)&local_538 + 0x10U) {
                operator_delete((void *)local_538._0_8_);
              }
              io::Printer::Printer(&local_538,pZVar8,'$');
              FileGenerator::GenerateSourceForExtension(&local_370,iVar4,&local_538);
              io::Printer::~Printer(&local_538);
              if (pZVar8 != (ZeroCopyOutputStream *)0x0) {
                (*pZVar8->_vptr_ZeroCopyOutputStream[1])(pZVar8);
              }
              iVar4 = iVar4 + 1;
            } while (iVar4 < (int)((ulong)((long)local_370.extension_generators_.
                                                 super__Vector_base<std::unique_ptr<google::protobuf::compiler::cpp::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::cpp::ExtensionGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::cpp::ExtensionGenerator>_>_>_>
                                                 ._M_impl.super__Vector_impl_data._M_finish -
                                          (long)local_370.extension_generators_.
                                                super__Vector_base<std::unique_ptr<google::protobuf::compiler::cpp::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::cpp::ExtensionGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::cpp::ExtensionGenerator>_>_>_>
                                                ._M_impl.super__Vector_impl_data._M_start) >> 3));
            number = number + iVar4;
          }
          iVar4 = (int)local_570;
          if (number < (int)local_570) {
            do {
              anon_unknown_8::NumberedCcFileName
                        ((string *)&local_538,(anon_unknown_8 *)local_5b8._0_8_,
                         (string *)local_5b8._8_8_,number);
              iVar5 = (*generator_context->_vptr_GeneratorContext[2])
                                (generator_context,(string *)&local_538);
              plVar11 = (long *)CONCAT44(extraout_var_07,iVar5);
              if (local_538._0_8_ != (long)&local_538 + 0x10U) {
                operator_delete((void *)local_538._0_8_);
              }
              if (plVar11 != (long *)0x0) {
                (**(code **)(*plVar11 + 8))(plVar11);
              }
              number = number + 1;
            } while (iVar4 != number);
          }
        }
        else {
          local_538._0_8_ = lVar1;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_538,local_5b8._0_8_,
                     (anon_unknown_8 *)
                     ((long)&((_Alloc_hider *)local_5b8._8_8_)->_M_p + local_5b8._0_8_));
          std::__cxx11::string::append(&local_538.variable_delimiter_);
          iVar4 = (*generator_context->_vptr_GeneratorContext[2])(generator_context,&local_538);
          pZVar8 = (ZeroCopyOutputStream *)CONCAT44(extraout_var_04,iVar4);
          if (local_538._0_8_ != lVar1) {
            operator_delete((void *)local_538._0_8_);
          }
          io::Printer::Printer(&local_538,pZVar8,'$');
          FileGenerator::GenerateSource(&local_370,&local_538);
          io::Printer::~Printer(&local_538);
          if (pZVar8 != (ZeroCopyOutputStream *)0x0) {
            (*pZVar8->_vptr_ZeroCopyOutputStream[1])(pZVar8);
          }
        }
        FileGenerator::~FileGenerator(&local_370);
      }
      if ((anon_unknown_8 *)local_5b8._0_8_ != (anon_unknown_8 *)(local_5b8 + 0x10)) {
        operator_delete((void *)local_5b8._0_8_);
      }
      bVar3 = true;
    }
LAB_00238d17:
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Rb_tree(&local_3d8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_410._M_p != &local_400) {
      operator_delete(local_410._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_430._M_p != &local_420) {
      operator_delete(local_430._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_458._M_p != &local_448) {
      operator_delete(local_458._M_p);
    }
    if ((undefined1 *)local_490._0_8_ != local_490 + 0x10) {
      operator_delete((void *)local_490._0_8_);
    }
    std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~vector(&local_5d8);
    return bVar3;
  }
  uVar14 = 0;
LAB_002380dd:
  iVar4 = std::__cxx11::string::compare
                    ((char *)(local_5d8.
                              super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start + uVar14));
  psVar6 = (string *)local_490;
  if (iVar4 == 0) goto LAB_00238317;
  iVar4 = std::__cxx11::string::compare
                    ((char *)(local_5d8.
                              super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start + uVar14));
  if (iVar4 == 0) {
    local_490[0x20] = true;
  }
  else {
    iVar4 = std::__cxx11::string::compare
                      ((char *)(local_5d8.
                                super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start + uVar14));
    if (iVar4 == 0) {
      local_490[0x23] = true;
    }
    else {
      iVar4 = std::__cxx11::string::compare
                        ((char *)(local_5d8.
                                  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start + uVar14));
      if (iVar4 == 0) {
        psVar6 = (string *)&local_430;
      }
      else {
        iVar4 = std::__cxx11::string::compare
                          ((char *)(local_5d8.
                                    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start + uVar14));
        if (iVar4 != 0) {
          iVar4 = std::__cxx11::string::compare
                            ((char *)(local_5d8.
                                      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start + uVar14));
          if (iVar4 == 0) {
            local_490._36_4_ = kSpeed;
          }
          else {
            iVar4 = std::__cxx11::string::compare
                              ((char *)(local_5d8.
                                        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start + uVar14));
            if (iVar4 == 0) {
              local_490._36_4_ = kCodeSize;
            }
            else {
              iVar4 = std::__cxx11::string::compare
                                ((char *)(local_5d8.
                                          super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start + uVar14));
              if (iVar4 == 0) {
                local_490._36_4_ = kLiteRuntime;
              }
              else {
                iVar4 = std::__cxx11::string::compare
                                  ((char *)(local_5d8.
                                            super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start + uVar14));
                if (iVar4 == 0) {
                  local_490._36_4_ = kLiteRuntime;
                  local_490[0x2a] = true;
                  if (local_5d8.
                      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[uVar14].second._M_string_length != 0
                     ) {
                    local_438 = strto32_adaptor(local_5d8.
                                                super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                                ._M_impl.super__Vector_impl_data._M_start[uVar14].
                                                second._M_dataplus._M_p,(char **)0x0,10);
                  }
                }
                else {
                  iVar4 = std::__cxx11::string::compare
                                    ((char *)(local_5d8.
                                              super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                              ._M_impl.super__Vector_impl_data._M_start + uVar14));
                  if (iVar4 == 0) {
                    local_490[0x2d] = true;
                  }
                  else {
                    iVar4 = std::__cxx11::string::compare
                                      ((char *)(local_5d8.
                                                super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                                ._M_impl.super__Vector_impl_data._M_start + uVar14))
                    ;
                    if (iVar4 == 0) {
                      local_3e0 = true;
                    }
                    else {
                      iVar4 = std::__cxx11::string::compare
                                        ((char *)(local_5d8.
                                                  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start + uVar14
                                                 ));
                      if (iVar4 == 0) {
                        uVar15 = 0;
                        local_498 = generator_context;
                        do {
                          uVar7 = std::__cxx11::string::find_first_of
                                            ((char *)&local_5d8.
                                                                                                            
                                                  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start[uVar14].
                                                  second,0x3d9f04,uVar15);
                          if (uVar7 == 0xffffffffffffffff) {
                            uVar7 = local_5d8.
                                    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start[uVar14].second.
                                    _M_string_length;
                          }
                          if (uVar15 < uVar7) {
                            std::__cxx11::string::substr
                                      ((ulong)&local_370,
                                       (ulong)&local_5d8.
                                               super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                               ._M_impl.super__Vector_impl_data._M_start[uVar14].
                                               second);
                            std::
                            _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                            ::_M_insert_unique<std::__cxx11::string>
                                      ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                                        *)&local_3d8,
                                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)&local_370);
                            if ((undefined1 **)local_370.weak_deps_._M_t._M_impl._0_8_ !=
                                (undefined1 **)((long)&local_370 + 0x10U)) {
                              operator_delete((void *)local_370.weak_deps_._M_t._M_impl._0_8_);
                            }
                          }
                          uVar15 = uVar7 + 1;
                          generator_context = local_498;
                        } while (uVar15 < local_5d8.
                                          super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start[uVar14].second.
                                          _M_string_length);
                      }
                      else {
                        iVar4 = std::__cxx11::string::compare
                                          ((char *)(local_5d8.
                                                                                                        
                                                  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start + uVar14
                                                  ));
                        if (iVar4 == 0) {
                          local_3a8._0_1_ = true;
                        }
                        else {
                          iVar4 = std::__cxx11::string::compare
                                            ((char *)(local_5d8.
                                                                                                            
                                                  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start + uVar14
                                                  ));
                          if (iVar4 == 0) {
                            local_3a8._1_1_ = true;
                          }
                          else {
                            iVar4 = std::__cxx11::string::compare
                                              ((char *)(local_5d8.
                                                                                                                
                                                  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start + uVar14
                                                  ));
                            if (iVar4 == 0) {
                              local_490[0x28] = true;
                            }
                            else {
                              iVar4 = std::__cxx11::string::compare
                                                ((char *)(local_5d8.
                                                                                                                    
                                                  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start + uVar14
                                                  ));
                              if (iVar4 == 0) {
                                local_490[0x29] = true;
                                goto LAB_0023833b;
                              }
                              iVar4 = std::__cxx11::string::compare
                                                ((char *)(local_5d8.
                                                                                                                    
                                                  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start + uVar14
                                                  ));
                              if (iVar4 != 0) {
                                std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                *)&local_370,"Unknown generator option: ",
                                               &local_5d8.
                                                super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                                ._M_impl.super__Vector_impl_data._M_start[uVar14].
                                                first);
LAB_00238de4:
                                std::__cxx11::string::operator=
                                          ((string *)local_578,(string *)&local_370);
                                if ((undefined1 **)local_370.weak_deps_._M_t._M_impl._0_8_ !=
                                    (undefined1 **)((long)&local_370 + 0x10U)) {
                                  operator_delete((void *)local_370.weak_deps_._M_t._M_impl._0_8_);
                                }
                                bVar3 = false;
                                goto LAB_00238d17;
                              }
                              iVar4 = std::__cxx11::string::compare
                                                ((char *)&local_5d8.
                                                                                                                    
                                                  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start[uVar14].
                                                  second);
                              if (iVar4 == 0) {
                                local_3e8 = kTCTableNever;
                              }
                              else {
                                iVar4 = std::__cxx11::string::compare
                                                  ((char *)&local_5d8.
                                                                                                                        
                                                  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start[uVar14].
                                                  second);
                                if (iVar4 == 0) {
                                  local_3e8 = kTCTableGuarded;
                                }
                                else {
                                  iVar4 = std::__cxx11::string::compare
                                                    ((char *)&local_5d8.
                                                                                                                            
                                                  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start[uVar14].
                                                  second);
                                  if (iVar4 != 0) {
                                    std::operator+((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)&local_370,
                                                  "Unknown value for experimental_tail_call_table_mode: "
                                                  ,&local_5d8.
                                                                                                        
                                                  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start[uVar14].
                                                  second);
                                    goto LAB_00238de4;
                                  }
                                  local_3e8 = kTCTableAlways;
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
          goto LAB_0023833b;
        }
        psVar6 = (string *)&local_410;
      }
LAB_00238317:
      std::__cxx11::string::_M_assign(psVar6);
    }
  }
LAB_0023833b:
  uVar14 = uVar14 + 1;
  if ((ulong)((long)local_5d8.
                    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)local_5d8.
                    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 6) <= uVar14) goto LAB_002384fa;
  goto LAB_002380dd;
}

Assistant:

bool CppGenerator::Generate(const FileDescriptor* file,
                            const std::string& parameter,
                            GeneratorContext* generator_context,
                            std::string* error) const {
  std::vector<std::pair<std::string, std::string> > options;
  ParseGeneratorParameter(parameter, &options);

  // -----------------------------------------------------------------
  // parse generator options

  // If the dllexport_decl option is passed to the compiler, we need to write
  // it in front of every symbol that should be exported if this .proto is
  // compiled into a Windows DLL.  E.g., if the user invokes the protocol
  // compiler as:
  //   protoc --cpp_out=dllexport_decl=FOO_EXPORT:outdir foo.proto
  // then we'll define classes like this:
  //   class FOO_EXPORT Foo {
  //     ...
  //   }
  // FOO_EXPORT is a macro which should expand to __declspec(dllexport) or
  // __declspec(dllimport) depending on what is being compiled.
  //
  Options file_options;

  file_options.opensource_runtime = opensource_runtime_;
  file_options.runtime_include_base = runtime_include_base_;

  for (int i = 0; i < options.size(); i++) {
    if (options[i].first == "dllexport_decl") {
      file_options.dllexport_decl = options[i].second;
    } else if (options[i].first == "safe_boundary_check") {
      file_options.safe_boundary_check = true;
    } else if (options[i].first == "annotate_headers") {
      file_options.annotate_headers = true;
    } else if (options[i].first == "annotation_pragma_name") {
      file_options.annotation_pragma_name = options[i].second;
    } else if (options[i].first == "annotation_guard_name") {
      file_options.annotation_guard_name = options[i].second;
    } else if (options[i].first == "speed") {
      file_options.enforce_mode = EnforceOptimizeMode::kSpeed;
    } else if (options[i].first == "code_size") {
      file_options.enforce_mode = EnforceOptimizeMode::kCodeSize;
    } else if (options[i].first == "lite") {
      file_options.enforce_mode = EnforceOptimizeMode::kLiteRuntime;
    } else if (options[i].first == "lite_implicit_weak_fields") {
      file_options.enforce_mode = EnforceOptimizeMode::kLiteRuntime;
      file_options.lite_implicit_weak_fields = true;
      if (!options[i].second.empty()) {
        file_options.num_cc_files =
            strto32(options[i].second.c_str(), NULL, 10);
      }
    } else if (options[i].first == "annotate_accessor") {
      file_options.annotate_accessor = true;
    } else if (options[i].first == "inject_field_listener_events") {
      file_options.field_listener_options.inject_field_listener_events = true;
    } else if (options[i].first == "forbidden_field_listener_events") {
      std::size_t pos = 0;
      do {
        std::size_t next_pos = options[i].second.find_first_of("+", pos);
        if (next_pos == std::string::npos) {
          next_pos = options[i].second.size();
        }
        if (next_pos > pos)
          file_options.field_listener_options.forbidden_field_listener_events
              .insert(options[i].second.substr(pos, next_pos - pos));
        pos = next_pos + 1;
      } while (pos < options[i].second.size());
    } else if (options[i].first == "eagerly_verified_lazy") {
      file_options.eagerly_verified_lazy = true;
    } else if (options[i].first == "force_eagerly_verified_lazy") {
      file_options.force_eagerly_verified_lazy = true;
    } else if (options[i].first == "table_driven_parsing") {
      file_options.table_driven_parsing = true;
    } else if (options[i].first == "table_driven_serialization") {
      file_options.table_driven_serialization = true;
    } else if (options[i].first == "experimental_tail_call_table_mode") {
      if (options[i].second == "never") {
        file_options.tctable_mode = Options::kTCTableNever;
      } else if (options[i].second == "guarded") {
        file_options.tctable_mode = Options::kTCTableGuarded;
      } else if (options[i].second == "always") {
        file_options.tctable_mode = Options::kTCTableAlways;
      } else {
        *error = "Unknown value for experimental_tail_call_table_mode: " +
                 options[i].second;
        return false;
      }
    } else {
      *error = "Unknown generator option: " + options[i].first;
      return false;
    }
  }

  // The safe_boundary_check option controls behavior for Google-internal
  // protobuf APIs.
  if (file_options.safe_boundary_check && file_options.opensource_runtime) {
    *error =
        "The safe_boundary_check option is not supported outside of Google.";
    return false;
  }

  // -----------------------------------------------------------------


  std::string basename = StripProto(file->name());

  if (MaybeBootstrap(file_options, generator_context, file_options.bootstrap,
                     &basename)) {
    return true;
  }

  FileGenerator file_generator(file, file_options);

  // Generate header(s).
  if (file_options.proto_h) {
    std::unique_ptr<io::ZeroCopyOutputStream> output(
        generator_context->Open(basename + ".proto.h"));
    GeneratedCodeInfo annotations;
    io::AnnotationProtoCollector<GeneratedCodeInfo> annotation_collector(
        &annotations);
    std::string info_path = basename + ".proto.h.meta";
    io::Printer printer(
        output.get(), '$',
        file_options.annotate_headers ? &annotation_collector : NULL);
    file_generator.GenerateProtoHeader(
        &printer, file_options.annotate_headers ? info_path : "");
    if (file_options.annotate_headers) {
      std::unique_ptr<io::ZeroCopyOutputStream> info_output(
          generator_context->Open(info_path));
      annotations.SerializeToZeroCopyStream(info_output.get());
    }
  }

  {
    std::unique_ptr<io::ZeroCopyOutputStream> output(
        generator_context->Open(basename + ".pb.h"));
    GeneratedCodeInfo annotations;
    io::AnnotationProtoCollector<GeneratedCodeInfo> annotation_collector(
        &annotations);
    std::string info_path = basename + ".pb.h.meta";
    io::Printer printer(
        output.get(), '$',
        file_options.annotate_headers ? &annotation_collector : NULL);
    file_generator.GeneratePBHeader(
        &printer, file_options.annotate_headers ? info_path : "");
    if (file_options.annotate_headers) {
      std::unique_ptr<io::ZeroCopyOutputStream> info_output(
          generator_context->Open(info_path));
      annotations.SerializeToZeroCopyStream(info_output.get());
    }
  }

  // Generate cc file(s).
  if (UsingImplicitWeakFields(file, file_options)) {
    {
      // This is the global .cc file, containing
      // enum/services/tables/reflection
      std::unique_ptr<io::ZeroCopyOutputStream> output(
          generator_context->Open(basename + ".pb.cc"));
      io::Printer printer(output.get(), '$');
      file_generator.GenerateGlobalSource(&printer);
    }

    int num_cc_files =
        file_generator.NumMessages() + file_generator.NumExtensions();

    // If we're using implicit weak fields then we allow the user to
    // optionally specify how many files to generate, not counting the global
    // pb.cc file. If we have more files than messages, then some files will
    // be generated as empty placeholders.
    if (file_options.num_cc_files > 0) {
      GOOGLE_CHECK_LE(num_cc_files, file_options.num_cc_files)
          << "There must be at least as many numbered .cc files as messages "
             "and extensions.";
      num_cc_files = file_options.num_cc_files;
    }
    int cc_file_number = 0;
    for (int i = 0; i < file_generator.NumMessages(); i++) {
      std::unique_ptr<io::ZeroCopyOutputStream> output(generator_context->Open(
          NumberedCcFileName(basename, cc_file_number++)));
      io::Printer printer(output.get(), '$');
      file_generator.GenerateSourceForMessage(i, &printer);
    }
    for (int i = 0; i < file_generator.NumExtensions(); i++) {
      std::unique_ptr<io::ZeroCopyOutputStream> output(generator_context->Open(
          NumberedCcFileName(basename, cc_file_number++)));
      io::Printer printer(output.get(), '$');
      file_generator.GenerateSourceForExtension(i, &printer);
    }
    // Create empty placeholder files if necessary to match the expected number
    // of files.
    for (; cc_file_number < num_cc_files; ++cc_file_number) {
      std::unique_ptr<io::ZeroCopyOutputStream> output(generator_context->Open(
          NumberedCcFileName(basename, cc_file_number)));
    }
  } else {
    std::unique_ptr<io::ZeroCopyOutputStream> output(
        generator_context->Open(basename + ".pb.cc"));
    io::Printer printer(output.get(), '$');
    file_generator.GenerateSource(&printer);
  }

  return true;
}